

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

Property *
tinyusdz::detail::MakeProperty<tinyusdz::Token>(Property *__return_storage_ptr__,Token *value)

{
  Attribute attr;
  
  Attribute::Attribute<tinyusdz::Token>(&attr,value,true);
  Property::Property(__return_storage_ptr__,&attr,false);
  Attribute::~Attribute(&attr);
  return __return_storage_ptr__;
}

Assistant:

Property MakeProperty(const T &value) {
  Attribute attr(value);
  Property prop(attr, /* custom */ false);

  return prop;
}